

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfrsbit.c
# Opt level: O0

FT_Error pfr_load_bitmap_metrics
                   (FT_Byte **pdata,FT_Byte *limit,FT_Long scaled_advance,FT_Long *axpos,
                   FT_Long *aypos,FT_UInt *axsize,FT_UInt *aysize,FT_Long *aadvance,FT_UInt *aformat
                   )

{
  byte bVar1;
  byte *pbVar2;
  uint local_68;
  uint local_64;
  FT_UInt ysize;
  FT_UInt xsize;
  FT_Long advance;
  FT_Long ypos;
  FT_Long xpos;
  FT_Byte *p;
  FT_Byte b;
  FT_Byte flags;
  FT_Error error;
  FT_UInt *axsize_local;
  FT_Long *aypos_local;
  FT_Long *axpos_local;
  FT_Long scaled_advance_local;
  FT_Byte *limit_local;
  FT_Byte **pdata_local;
  
  p._4_4_ = 0;
  pbVar2 = *pdata;
  if (limit < pbVar2 + 1) {
LAB_003030bf:
    p._4_4_ = 8;
  }
  else {
    xpos = (FT_Long)(pbVar2 + 1);
    bVar1 = *pbVar2;
    ypos = 0;
    advance = 0;
    local_64 = 0;
    local_68 = 0;
    _ysize = 0;
    switch(bVar1 & 3) {
    case 0:
      if (limit < pbVar2 + 2) goto LAB_003030bf;
      ypos = (FT_Long)((int)(char)*(byte *)xpos >> 4);
      advance = (FT_Long)((int)(char)(*(byte *)xpos << 4) >> 4);
      xpos = (FT_Long)(pbVar2 + 2);
      break;
    case 1:
      if (limit < pbVar2 + 3) goto LAB_003030bf;
      ypos = (FT_Long)(char)*(byte *)xpos;
      advance = (FT_Long)(char)pbVar2[2];
      xpos = (FT_Long)(pbVar2 + 3);
      break;
    case 2:
      if (limit < pbVar2 + 5) goto LAB_003030bf;
      ypos = (FT_Long)CONCAT11(pbVar2[1],pbVar2[2]);
      advance = (FT_Long)CONCAT11(pbVar2[3],pbVar2[4]);
      xpos = (FT_Long)(pbVar2 + 5);
      break;
    case 3:
      if (limit < pbVar2 + 7) goto LAB_003030bf;
      ypos = (FT_Long)((int)((uint)pbVar2[1] << 0x18 | (uint)pbVar2[2] << 0x10 |
                            (uint)pbVar2[3] << 8) >> 8);
      advance = (FT_Long)((int)((uint)pbVar2[4] << 0x18 | (uint)pbVar2[5] << 0x10 |
                               (uint)pbVar2[6] << 8) >> 8);
      xpos = (FT_Long)(pbVar2 + 7);
    }
    switch(bVar1 >> 2 & 3) {
    case 0:
      local_64 = 0;
      local_68 = 0;
      break;
    case 1:
      if (limit < (FT_Byte *)(xpos + 1U)) goto LAB_003030bf;
      local_64 = (int)(uint)*(byte *)xpos >> 4;
      local_68 = *(byte *)xpos & 0xf;
      xpos = xpos + 1;
      break;
    case 2:
      if (limit < (FT_Byte *)(xpos + 2U)) goto LAB_003030bf;
      local_64 = (uint)*(byte *)xpos;
      local_68 = (uint)*(byte *)(xpos + 1);
      xpos = xpos + 2;
      break;
    case 3:
      if (limit < (FT_Byte *)(xpos + 4U)) goto LAB_003030bf;
      local_64 = (uint)CONCAT11(*(undefined1 *)xpos,*(undefined1 *)(xpos + 1));
      local_68 = (uint)CONCAT11(*(undefined1 *)(xpos + 2),*(undefined1 *)(xpos + 3));
      xpos = xpos + 4;
    }
    switch(bVar1 >> 4 & 3) {
    case 0:
      _ysize = scaled_advance;
      break;
    case 1:
      if (limit < (FT_Byte *)(xpos + 1U)) goto LAB_003030bf;
      _ysize = (FT_Long)((int)*(char *)xpos << 8);
      xpos = xpos + 1;
      break;
    case 2:
      if (limit < (FT_Byte *)(xpos + 2U)) goto LAB_003030bf;
      _ysize = (FT_Long)CONCAT11(*(undefined1 *)xpos,*(undefined1 *)(xpos + 1));
      xpos = xpos + 2;
      break;
    case 3:
      if (limit < (FT_Byte *)(xpos + 3U)) goto LAB_003030bf;
      _ysize = (FT_Long)((int)((uint)*(byte *)xpos << 0x18 | (uint)*(byte *)(xpos + 1) << 0x10 |
                              (uint)*(byte *)(xpos + 2) << 8) >> 8);
      xpos = xpos + 3;
    }
    *axpos = ypos;
    *aypos = advance;
    *axsize = local_64;
    *aysize = local_68;
    *aadvance = _ysize;
    *aformat = (int)(uint)(bVar1 >> 4) >> 2;
    *pdata = (FT_Byte *)xpos;
  }
  return p._4_4_;
}

Assistant:

static FT_Error
  pfr_load_bitmap_metrics( FT_Byte**  pdata,
                           FT_Byte*   limit,
                           FT_Long    scaled_advance,
                           FT_Long   *axpos,
                           FT_Long   *aypos,
                           FT_UInt   *axsize,
                           FT_UInt   *aysize,
                           FT_Long   *aadvance,
                           FT_UInt   *aformat )
  {
    FT_Error  error = FT_Err_Ok;
    FT_Byte   flags;
    FT_Byte   b;
    FT_Byte*  p = *pdata;
    FT_Long   xpos, ypos, advance;
    FT_UInt   xsize, ysize;


    PFR_CHECK( 1 );
    flags = PFR_NEXT_BYTE( p );

    xpos    = 0;
    ypos    = 0;
    xsize   = 0;
    ysize   = 0;
    advance = 0;

    switch ( flags & 3 )
    {
    case 0:
      PFR_CHECK( 1 );
      b    = PFR_NEXT_BYTE( p );
      xpos = (FT_Char)b >> 4;
      ypos = ( (FT_Char)( b << 4 ) ) >> 4;
      break;

    case 1:
      PFR_CHECK( 2 );
      xpos = PFR_NEXT_INT8( p );
      ypos = PFR_NEXT_INT8( p );
      break;

    case 2:
      PFR_CHECK( 4 );
      xpos = PFR_NEXT_SHORT( p );
      ypos = PFR_NEXT_SHORT( p );
      break;

    case 3:
      PFR_CHECK( 6 );
      xpos = PFR_NEXT_LONG( p );
      ypos = PFR_NEXT_LONG( p );
      break;

    default:
      ;
    }

    flags >>= 2;
    switch ( flags & 3 )
    {
    case 0:
      /* blank image */
      xsize = 0;
      ysize = 0;
      break;

    case 1:
      PFR_CHECK( 1 );
      b     = PFR_NEXT_BYTE( p );
      xsize = ( b >> 4 ) & 0xF;
      ysize = b & 0xF;
      break;

    case 2:
      PFR_CHECK( 2 );
      xsize = PFR_NEXT_BYTE( p );
      ysize = PFR_NEXT_BYTE( p );
      break;

    case 3:
      PFR_CHECK( 4 );
      xsize = PFR_NEXT_USHORT( p );
      ysize = PFR_NEXT_USHORT( p );
      break;

    default:
      ;
    }

    flags >>= 2;
    switch ( flags & 3 )
    {
    case 0:
      advance = scaled_advance;
      break;

    case 1:
      PFR_CHECK( 1 );
      advance = PFR_NEXT_INT8( p ) * 256;
      break;

    case 2:
      PFR_CHECK( 2 );
      advance = PFR_NEXT_SHORT( p );
      break;

    case 3:
      PFR_CHECK( 3 );
      advance = PFR_NEXT_LONG( p );
      break;

    default:
      ;
    }

    *axpos    = xpos;
    *aypos    = ypos;
    *axsize   = xsize;
    *aysize   = ysize;
    *aadvance = advance;
    *aformat  = flags >> 2;
    *pdata    = p;

  Exit:
    return error;

  Too_Short:
    error = FT_THROW( Invalid_Table );
    FT_ERROR(( "pfr_load_bitmap_metrics: invalid glyph data\n" ));
    goto Exit;
  }